

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O1

char * zlib_mem_inflate(char *cdata,size_t csize,size_t *size)

{
  int iVar1;
  char *__ptr;
  char *pcVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar5 [16];
  char *local_a0;
  uint local_98;
  undefined8 local_90;
  char *local_88;
  int local_80;
  size_t local_78;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  
  auVar5._8_4_ = (int)(csize >> 0x20);
  auVar5._0_8_ = csize;
  auVar5._12_4_ = 0x45300000;
  iVar3 = (int)(((auVar5._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(uint)csize) - 4503599627370496.0)) * 1.2 + 100.0);
  __ptr = (char *)malloc((long)iVar3);
  if (__ptr != (char *)0x0) {
    local_60 = 0;
    uStack_58 = 0;
    local_50 = 0;
    local_90 = 0;
    local_78 = 0;
    local_a0 = cdata;
    local_98 = (uint)csize;
    local_88 = __ptr;
    local_80 = iVar3;
    iVar1 = inflateInit2_(&local_a0,0x2f,"1.2.11",0x70);
    if (iVar1 == 0) {
      do {
        pcVar2 = __ptr;
        if (local_98 == 0) goto LAB_0012ced5;
        local_88 = __ptr + local_78;
        iVar1 = inflate(&local_a0,0);
        if (iVar1 == 0) {
          iVar1 = (int)((((double)CONCAT44(0x45300000,(int)(local_78 >> 0x20)) -
                         1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)local_78) - 4503599627370496.0)) *
                        ((double)local_98 /
                        (((double)CONCAT44(0x45300000,(int)((ulong)local_90 >> 0x20)) -
                         1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)local_90) - 4503599627370496.0))) + 100.0)
          ;
          iVar3 = iVar3 + iVar1;
          pcVar2 = (char *)realloc(__ptr,(long)iVar3);
          if (pcVar2 == (char *)0x0) {
            free(__ptr);
            iVar4 = 1;
            pcVar2 = (char *)0x0;
          }
          else {
            local_80 = local_80 + iVar1;
            iVar4 = 0;
          }
        }
        else {
          iVar4 = 2;
          if (iVar1 != 1) {
            zlib_mem_inflate_cold_2();
          }
        }
        __ptr = pcVar2;
      } while (iVar4 == 0);
      if (iVar4 == 2) {
LAB_0012ced5:
        inflateEnd(&local_a0);
        *size = local_78;
        return pcVar2;
      }
    }
    else {
      zlib_mem_inflate_cold_1();
    }
  }
  return (char *)0x0;
}

Assistant:

char *zlib_mem_inflate(char *cdata, size_t csize, size_t *size) {
    z_stream s;
    unsigned char *data = NULL; /* Uncompressed output */
    int data_alloc = 0;
    int err;

    /* Starting point at uncompressed size, and scale after that */
    data = malloc(data_alloc = csize*1.2+100);
    if (!data)
	return NULL;

    /* Initialise zlib stream */
    s.zalloc = Z_NULL; /* use default allocation functions */
    s.zfree  = Z_NULL;
    s.opaque = Z_NULL;
    s.next_in  = (unsigned char *)cdata;
    s.avail_in = csize;
    s.total_in = 0;
    s.next_out  = data;
    s.avail_out = data_alloc;
    s.total_out = 0;

    //err = inflateInit(&s);
    err = inflateInit2(&s, 15 + 32);
    if (err != Z_OK) {
	fprintf(stderr, "zlib inflateInit error: %s\n", s.msg);
	free(data);
	return NULL;
    }

    /* Decode to 'data' array */
    for (;s.avail_in;) {
	unsigned char *data_tmp;
	int alloc_inc;

	s.next_out = &data[s.total_out];
	err = inflate(&s, Z_NO_FLUSH);
	if (err == Z_STREAM_END)
	    break;

	if (err != Z_OK) {
	    fprintf(stderr, "zlib inflate error: %s\n", s.msg);
	    break;
	}

	/* More to come, so realloc based on growth so far */
	alloc_inc = (double)s.avail_in/s.total_in * s.total_out + 100;
	data = realloc((data_tmp = data), data_alloc += alloc_inc);
	if (!data) {
	    free(data_tmp);
	    return NULL;
	}
	s.avail_out += alloc_inc;
    }
    inflateEnd(&s);

    *size = s.total_out;
    return (char *)data;
}